

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O0

void exception_destroy(exception ex)

{
  int iVar1;
  uintmax_t uVar2;
  long *in_RDI;
  char *local_20;
  exception in_stack_ffffffffffffffe8;
  
  if (in_RDI != (long *)0x0) {
    iVar1 = exception_decrement_reference(in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      if (in_RDI[1] == 0) {
        local_20 = "<anonymous>";
      }
      else {
        local_20 = (char *)in_RDI[1];
      }
      log_write_impl_va("metacall",0xeb,"exception_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_exception.c"
                        ,LOG_LEVEL_ERROR,"Invalid reference counter in exception: %s",local_20);
    }
    uVar2 = threading_atomic_ref_count_load((threading_atomic_ref_count)(in_RDI + 5));
    if (uVar2 == 0) {
      if (*in_RDI != 0) {
        free((void *)*in_RDI);
      }
      if (in_RDI[1] != 0) {
        free((void *)in_RDI[1]);
      }
      if (in_RDI[3] != 0) {
        free((void *)in_RDI[3]);
      }
      threading_atomic_ref_count_destroy((threading_atomic_ref_count)(in_RDI + 5));
      free(in_RDI);
      LOCK();
      exception_stats.deallocations = exception_stats.deallocations + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void exception_destroy(exception ex)
{
	if (ex != NULL)
	{
		if (exception_decrement_reference(ex) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in exception: %s", ex->label ? ex->label : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&ex->ref) == 0)
		{
			if (ex->message != NULL)
			{
				free(ex->message);
			}

			if (ex->label != NULL)
			{
				free(ex->label);
			}

			if (ex->stacktrace != NULL)
			{
				free(ex->stacktrace);
			}

			threading_atomic_ref_count_destroy(&ex->ref);

			free(ex);

			reflect_memory_tracker_deallocation(exception_stats);
		}
	}
}